

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O0

void __thiscall leveldb::TestState::TestState(TestState *this,int s)

{
  int s_local;
  TestState *this_local;
  
  ConcurrentTest::ConcurrentTest(&this->t_);
  this->seed_ = s;
  std::atomic<bool>::atomic(&this->quit_flag_,false);
  port::Mutex::Mutex(&this->mu_);
  this->state_ = STARTING;
  port::CondVar::CondVar(&this->state_cv_,&this->mu_);
  return;
}

Assistant:

explicit TestState(int s)
      : seed_(s), quit_flag_(false), state_(STARTING), state_cv_(&mu_) {}